

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<long_double>_>::InsertSub
          (TPZMatrix<std::complex<long_double>_> *this,int64_t sRow,int64_t sCol,int64_t rowSize,
          int64_t colSize,int64_t pRow,int64_t pCol,TPZMatrix<std::complex<long_double>_> *pA)

{
  TPZBaseMatrix *pTVar1;
  long lVar2;
  int iVar3;
  int64_t iVar4;
  long lVar5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  TPZBaseMatrix *in_stack_00000010;
  int64_t c;
  int64_t col;
  int64_t r;
  int64_t row;
  int64_t NewColSize;
  int64_t NewRowSize;
  char *in_stack_00000148;
  char *in_stack_00000150;
  undefined1 local_88 [32];
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar4 = TPZBaseMatrix::Rows(in_stack_00000010);
  if ((in_R9 + in_RCX <= iVar4) &&
     (lVar5 = in_stack_00000008 + local_30, iVar4 = TPZBaseMatrix::Cols(in_stack_00000010),
     lVar5 <= iVar4)) {
    local_40 = local_28 + local_38;
    local_48 = local_30 + in_stack_00000008;
    local_50 = local_18;
    for (local_58 = local_38; local_58 < local_40; local_58 = local_58 + 1) {
      local_60 = local_20;
      for (local_68 = in_stack_00000008; lVar2 = local_58, lVar5 = local_68,
          pTVar1 = in_stack_00000010, local_68 < local_48; local_68 = local_68 + 1) {
        (**(code **)(*in_RDI + 0x120))(local_88,in_RDI,local_50,local_60);
        (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0x23])(pTVar1,lVar2,lVar5,local_88);
        local_60 = local_60 + 1;
      }
      local_50 = local_50 + 1;
    }
    return 1;
  }
  iVar3 = Error(in_stack_00000150,in_stack_00000148);
  return iVar3;
}

Assistant:

int TPZMatrix<TVar>::InsertSub(const int64_t sRow,const int64_t sCol,const int64_t rowSize,
							   const int64_t colSize,const int64_t pRow,const int64_t pCol, TPZMatrix<TVar> *pA ) const {
	
	
    if ( ((pRow + rowSize) > pA->Rows()) || ((pCol + colSize) > pA->Cols())) {
        return( Error( "InsertSub <the sub-matrix is too big that target>" ) );
    }
	
    int64_t NewRowSize = rowSize+pRow;
    int64_t NewColSize = colSize+pCol;
	
	
    int64_t row = sRow;
    for ( int64_t r = pRow; r < NewRowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = pCol ; c < NewColSize; c++, col++ ) {
            pA->PutVal( r, c, GetVal( row, col ) );
        }
    }
    return( 1 );
}